

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O1

VarType * __thiscall vkt::ubo::VarType::operator=(VarType *this,VarType *other)

{
  Type TVar1;
  VarType *pVVar2;
  undefined8 uVar3;
  VarType *this_00;
  
  if (this != other) {
    if ((this->m_type == TYPE_ARRAY) &&
       (pVVar2 = (this->m_data).array.elementType, pVVar2 != (VarType *)0x0)) {
      ~VarType(pVVar2);
      operator_delete(pVVar2,0x18);
    }
    TVar1 = other->m_type;
    this->m_type = TVar1;
    this->m_flags = other->m_flags;
    (this->m_data).array.elementType = (VarType *)0x0;
    (this->m_data).array.size = 0;
    if (TVar1 == TYPE_ARRAY) {
      this_00 = (VarType *)operator_new(0x18);
      pVVar2 = (other->m_data).array.elementType;
      this_00->m_type = TYPE_LAST;
      *(undefined8 *)&this_00->m_flags = 0;
      *(undefined8 *)((long)&(this_00->m_data).array.elementType + 4) = 0;
      operator=(this_00,pVVar2);
      (this->m_data).array.elementType = this_00;
      (this->m_data).array.size = (other->m_data).array.size;
    }
    else {
      uVar3 = *(undefined8 *)((long)&other->m_data + 8);
      (this->m_data).array.elementType = (other->m_data).array.elementType;
      *(undefined8 *)((long)&this->m_data + 8) = uVar3;
    }
  }
  return this;
}

Assistant:

VarType& VarType::operator= (const VarType& other)
{
	if (this == &other)
		return *this; // Self-assignment.

	if (m_type == TYPE_ARRAY)
		delete m_data.array.elementType;

	m_type	= other.m_type;
	m_flags	= other.m_flags;
	m_data	= Data();

	if (m_type == TYPE_ARRAY)
	{
		m_data.array.elementType	= new VarType(*other.m_data.array.elementType);
		m_data.array.size			= other.m_data.array.size;
	}
	else
		m_data = other.m_data;

	return *this;
}